

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

ly_bool lys_has_compiled(lys_module *mod)

{
  lysp_module *plVar1;
  lysp_include *plVar2;
  lysp_submodule *plVar3;
  ulong uVar4;
  lysp_include *plVar5;
  ulong uVar6;
  
  plVar1 = mod->parsed;
  if ((((plVar1->data == (lysp_node *)0x0) && (plVar1->rpcs == (lysp_node_action *)0x0)) &&
      (plVar1->notifs == (lysp_node_notif *)0x0)) &&
     (((plVar1->exts == (lysp_ext_instance *)0x0 && (plVar1->augments == (lysp_node_augment *)0x0))
      && (plVar1->deviations == (lysp_deviation *)0x0)))) {
    plVar2 = plVar1->includes;
    uVar4 = 0xffffffffffffffff;
    plVar5 = plVar2;
    do {
      if (plVar2 == (lysp_include *)0x0) {
        uVar6 = 0;
      }
      else {
        uVar6 = *(ulong *)(plVar2[-1].rev + 8);
      }
      uVar4 = uVar4 + 1;
      if (uVar6 <= uVar4) {
        return '\0';
      }
      plVar3 = plVar5->submodule;
    } while (((plVar3->data == (lysp_node *)0x0) && (plVar3->rpcs == (lysp_node_action *)0x0)) &&
            ((plVar3->notifs == (lysp_node_notif *)0x0 &&
             (((plVar3->exts == (lysp_ext_instance *)0x0 &&
               (plVar3->augments == (lysp_node_augment *)0x0)) &&
              (plVar5 = plVar5 + 1, plVar3->deviations == (lysp_deviation *)0x0))))));
  }
  return '\x01';
}

Assistant:

ly_bool
lys_has_compiled(const struct lys_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;

    if (LYSP_HAS_COMPILED(mod->parsed)) {
        return 1;
    }

    LY_ARRAY_FOR(mod->parsed->includes, u) {
        if (LYSP_HAS_COMPILED(mod->parsed->includes[u].submodule)) {
            return 1;
        }
    }

    return 0;
}